

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O2

void __thiscall cmSourceGroup::~cmSourceGroup(cmSourceGroup *this)

{
  cmSourceGroupInternals *this_00;
  
  this_00 = this->Internal;
  if (this_00 != (cmSourceGroupInternals *)0x0) {
    std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&this_00->GroupChildren);
  }
  operator_delete(this_00,0x18);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&(this->SourceFiles).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->GroupFiles)._M_t);
  cmsys::RegularExpression::~RegularExpression(&this->GroupRegex);
  std::__cxx11::string::~string((string *)&this->FullName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmSourceGroup::~cmSourceGroup()
{
  delete this->Internal;
}